

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

uint __thiscall v128::To<unsigned_int>(v128 *this,int lane)

{
  if ((long)lane * 4 + 4U < 0x11) {
    return *(uint *)(this->v + (long)lane * 4);
  }
  __assert_fail("(lane + 1) * sizeof(T) <= sizeof(v)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/common.h"
                ,0x8b,"T v128::To(int) const [T = unsigned int]");
}

Assistant:

T To(int lane) const {
    static_assert(sizeof(T) <= sizeof(v), "Invalid cast!");
    assert((lane + 1) * sizeof(T) <= sizeof(v));
    T result;
    wabt::MemcpyEndianAware(&result, v, sizeof(result), sizeof(v), 0,
                            lane * sizeof(T), sizeof(result));
    return result;
  }